

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# depth_first_traverser.h
# Opt level: O2

bool __thiscall
draco::
DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::TraverseFromCorner
          (DepthFirstTraverser<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
           *this,CornerIndex corner_id)

{
  vector<bool,_std::allocator<bool>_> *this_00;
  pointer *ppIVar1;
  VertexIndex vert_id;
  CornerTable *pCVar2;
  bool bVar3;
  const_reference cVar4;
  bool bVar5;
  value_type vVar6;
  uint uVar7;
  CornerIndex CVar8;
  pointer pIVar9;
  VertexIndex VVar10;
  ulong uVar11;
  ulong uVar12;
  pointer pIVar13;
  value_type local_48;
  CornerIndex right_corner_id;
  
  local_48.value_ = corner_id.value_;
  bVar3 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
          ::IsFaceVisited(&this->
                           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                          ,corner_id);
  if (!bVar3) {
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar9) {
      (this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar9;
    }
    std::
    vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ::push_back(&this->corner_traversal_stack_,&local_48);
    pCVar2 = (this->
             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
             ).corner_table_;
    if (local_48.value_ == 0xffffffff) {
      pIVar13 = (pCVar2->corner_to_vertex_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      VVar10.value_ = pIVar13[0xffffffff].value_;
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = local_48.value_ - 2;
      if ((local_48.value_ + 1) % 3 != 0) {
        uVar7 = local_48.value_ + 1;
      }
      pIVar13 = (pCVar2->corner_to_vertex_map_).
                super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      VVar10.value_ = pIVar13[uVar7].value_;
      if (local_48.value_ % 3 == 0) {
        uVar7 = local_48.value_ + 2;
      }
      else {
        uVar7 = local_48.value_ - 1;
      }
    }
    if (VVar10.value_ == 0xffffffff) {
      return false;
    }
    vert_id.value_ = pIVar13[uVar7].value_;
    if (vert_id.value_ == 0xffffffff) {
      return false;
    }
    this_00 = &(this->
               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
               ).is_vertex_visited_;
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)VVar10.value_);
    if (!cVar4) {
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::MarkVertexVisited(&this->
                           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                          ,VVar10);
      if (local_48.value_ == 0xffffffff) {
        CVar8.value_ = 0xffffffff;
      }
      else {
        CVar8.value_ = local_48.value_ - 2;
        if ((local_48.value_ + 1) % 3 != 0) {
          CVar8.value_ = local_48.value_ + 1;
        }
      }
      MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
                (&(this->
                  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ).traversal_observer_,VVar10,CVar8);
    }
    cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)vert_id.value_);
    if (!cVar4) {
      TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
      ::MarkVertexVisited(&this->
                           super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                          ,vert_id);
      if (local_48.value_ == 0xffffffff) {
        CVar8.value_ = 0xffffffff;
      }
      else if (local_48.value_ % 3 == 0) {
        CVar8.value_ = local_48.value_ + 2;
      }
      else {
        CVar8.value_ = local_48.value_ - 1;
      }
      MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::OnNewVertexVisited
                (&(this->
                  super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ).traversal_observer_,vert_id,CVar8);
    }
LAB_0012ea79:
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != pIVar9) {
      local_48.value_ = pIVar9[-1].value_;
      if (local_48.value_ == 0xffffffff) {
LAB_0012eab4:
        (this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pIVar9 + -1;
      }
      else {
        uVar11 = (ulong)local_48.value_;
        bVar3 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                ::IsFaceVisited(&this->
                                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                ,(FaceIndex)(uint)(uVar11 / 3));
        uVar11 = uVar11 / 3;
        vVar6.value_ = local_48.value_;
        if (bVar3) {
          pIVar9 = (this->corner_traversal_stack_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          goto LAB_0012eab4;
        }
LAB_0012eac1:
        do {
          local_48.value_ = vVar6.value_;
          TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
          ::MarkFaceVisited(&this->
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                            ,(FaceIndex)(uint)uVar11);
          VVar10.value_ =
               (((this->
                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                 ).corner_table_)->corner_to_vertex_map_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_48.value_].value_;
          if ((ulong)VVar10.value_ == 0xffffffff) {
            return false;
          }
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](this_00,(ulong)VVar10.value_)
          ;
          if (!cVar4) {
            bVar3 = MeshAttributeCornerTable::IsOnBoundary
                              ((this->
                               super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                               ).corner_table_,VVar10);
            TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
            ::MarkVertexVisited(&this->
                                 super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                ,VVar10);
            MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>::
            OnNewVertexVisited(&(this->
                                super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                ).traversal_observer_,VVar10,(CornerIndex)local_48.value_);
            if (!bVar3) {
              vVar6.value_ = (uint)MeshAttributeCornerTable::GetRightCorner
                                             ((this->
                                              super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                              ).corner_table_,local_48.value_);
              uVar11 = (ulong)vVar6.value_ / 3;
              goto LAB_0012eac1;
            }
          }
          right_corner_id =
               MeshAttributeCornerTable::GetRightCorner
                         ((this->
                          super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                          ).corner_table_,local_48.value_);
          CVar8 = MeshAttributeCornerTable::GetLeftCorner
                            ((this->
                             super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                             ).corner_table_,local_48.value_);
          uVar11 = (ulong)right_corner_id.value_ / 3;
          if (right_corner_id.value_ == 0xffffffff) {
            uVar11 = 0xffffffff;
          }
          uVar12 = (ulong)CVar8.value_ / 3;
          if (CVar8.value_ == 0xffffffff) {
            uVar12 = 0xffffffff;
          }
          bVar3 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ::IsFaceVisited(&this->
                                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                  ,(FaceIndex)(uint)uVar11);
          bVar5 = TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                  ::IsFaceVisited(&this->
                                   super_TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
                                  ,(FaceIndex)(uint)uVar12);
          if (!bVar3) {
            vVar6.value_ = right_corner_id;
            if (!bVar5) {
              (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].value_ = CVar8.value_;
              std::
              vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ::push_back(&this->corner_traversal_stack_,&right_corner_id);
              goto LAB_0012ea79;
            }
            goto LAB_0012eac1;
          }
          uVar11 = uVar12;
          vVar6.value_ = CVar8.value_;
        } while (!bVar5);
        ppIVar1 = &(this->corner_traversal_stack_).
                   super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + -1;
      }
      goto LAB_0012ea79;
    }
  }
  return true;
}

Assistant:

bool TraverseFromCorner(CornerIndex corner_id) {
    if (this->IsFaceVisited(corner_id)) {
      return true;  // Already traversed.
    }

    corner_traversal_stack_.clear();
    corner_traversal_stack_.push_back(corner_id);
    // For the first face, check the remaining corners as they may not be
    // processed yet.
    const VertexIndex next_vert =
        this->corner_table()->Vertex(this->corner_table()->Next(corner_id));
    const VertexIndex prev_vert =
        this->corner_table()->Vertex(this->corner_table()->Previous(corner_id));
    if (next_vert == kInvalidVertexIndex || prev_vert == kInvalidVertexIndex) {
      return false;
    }
    if (!this->IsVertexVisited(next_vert)) {
      this->MarkVertexVisited(next_vert);
      this->traversal_observer().OnNewVertexVisited(
          next_vert, this->corner_table()->Next(corner_id));
    }
    if (!this->IsVertexVisited(prev_vert)) {
      this->MarkVertexVisited(prev_vert);
      this->traversal_observer().OnNewVertexVisited(
          prev_vert, this->corner_table()->Previous(corner_id));
    }

    // Start the actual traversal.
    while (!corner_traversal_stack_.empty()) {
      // Currently processed corner.
      corner_id = corner_traversal_stack_.back();
      FaceIndex face_id(corner_id.value() / 3);
      // Make sure the face hasn't been visited yet.
      if (corner_id == kInvalidCornerIndex || this->IsFaceVisited(face_id)) {
        // This face has been already traversed.
        corner_traversal_stack_.pop_back();
        continue;
      }
      while (true) {
        this->MarkFaceVisited(face_id);
        this->traversal_observer().OnNewFaceVisited(face_id);
        const VertexIndex vert_id = this->corner_table()->Vertex(corner_id);
        if (vert_id == kInvalidVertexIndex) {
          return false;
        }
        if (!this->IsVertexVisited(vert_id)) {
          const bool on_boundary = this->corner_table()->IsOnBoundary(vert_id);
          this->MarkVertexVisited(vert_id);
          this->traversal_observer().OnNewVertexVisited(vert_id, corner_id);
          if (!on_boundary) {
            corner_id = this->corner_table()->GetRightCorner(corner_id);
            face_id = FaceIndex(corner_id.value() / 3);
            continue;
          }
        }
        // The current vertex has been already visited or it was on a boundary.
        // We need to determine whether we can visit any of it's neighboring
        // faces.
        const CornerIndex right_corner_id =
            this->corner_table()->GetRightCorner(corner_id);
        const CornerIndex left_corner_id =
            this->corner_table()->GetLeftCorner(corner_id);
        const FaceIndex right_face_id(
            (right_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(right_corner_id.value() / 3)));
        const FaceIndex left_face_id(
            (left_corner_id == kInvalidCornerIndex
                 ? kInvalidFaceIndex
                 : FaceIndex(left_corner_id.value() / 3)));
        if (this->IsFaceVisited(right_face_id)) {
          // Right face has been already visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Both neighboring faces are visited. End reached.
            corner_traversal_stack_.pop_back();
            break;  // Break from the while (true) loop.
          } else {
            // Go to the left face.
            corner_id = left_corner_id;
            face_id = left_face_id;
          }
        } else {
          // Right face was not visited.
          if (this->IsFaceVisited(left_face_id)) {
            // Left face visited, go to the right one.
            corner_id = right_corner_id;
            face_id = right_face_id;
          } else {
            // Both neighboring faces are unvisited, we need to visit both of
            // them.

            // Split the traversal.
            // First make the top of the current corner stack point to the left
            // face (this one will be processed second).
            corner_traversal_stack_.back() = left_corner_id;
            // Add a new corner to the top of the stack (right face needs to
            // be traversed first).
            corner_traversal_stack_.push_back(right_corner_id);
            // Break from the while (true) loop.
            break;
          }
        }
      }
    }
    return true;
  }